

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeBase * __thiscall
ExpressionContext::GetBinaryOpResultType(ExpressionContext *this,TypeBase *a,TypeBase *b)

{
  TypeBase *pTVar1;
  TypeBase *pTVar2;
  
  pTVar2 = this->typeDouble;
  if ((((pTVar2 != b && pTVar2 != a) && (pTVar2 = this->typeFloat, pTVar2 != b && pTVar2 != a)) &&
      (pTVar2 = this->typeLong, pTVar2 != b && pTVar2 != a)) &&
     (((pTVar2 = this->typeInt, pTVar2 != b && pTVar2 != a &&
       (pTVar2 = this->typeShort, pTVar2 != b && pTVar2 != a)) &&
      (pTVar2 = this->typeChar, pTVar2 != b && pTVar2 != a)))) {
    pTVar1 = this->typeBool;
    pTVar2 = (TypeBase *)0x0;
    if (pTVar1 == b) {
      pTVar2 = pTVar1;
    }
    if (pTVar1 == a) {
      pTVar2 = pTVar1;
    }
  }
  return pTVar2;
}

Assistant:

TypeBase* ExpressionContext::GetBinaryOpResultType(TypeBase* a, TypeBase* b)
{
	if(a == typeDouble || b == typeDouble)
		return typeDouble;

	if(a == typeFloat || b == typeFloat)
		return typeFloat;

	if(a == typeLong || b == typeLong)
		return typeLong;

	if(a == typeInt || b == typeInt)
		return typeInt;

	if(a == typeShort || b == typeShort)
		return typeShort;

	if(a == typeChar || b == typeChar)
		return typeChar;

	if(a == typeBool || b == typeBool)
		return typeBool;

	return NULL;
}